

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O0

void __thiscall
cmCustomCommand::SetCommandLines(cmCustomCommand *this,cmCustomCommandLines *commandLines)

{
  cmCustomCommandLines *commandLines_local;
  cmCustomCommand *this_local;
  
  cmCustomCommandLines::operator=(&this->CommandLines,commandLines);
  return;
}

Assistant:

void cmCustomCommand::SetCommandLines(cmCustomCommandLines commandLines)
{
  this->CommandLines = std::move(commandLines);
}